

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listOutput.cpp
# Opt level: O1

void __thiscall listOutput::takeValue(listOutput *this)

{
  int iVar1;
  outputArrow *poVar2;
  WINDOW *pWVar3;
  int iVar4;
  string local_48;
  
  poVar2 = (this->super_output).outArr;
  iVar4 = (*(poVar2->super_arrowType)._vptr_arrowType[2])(poVar2,0xfffffffe);
  pWVar3 = this->outWin;
  iVar1 = this->current;
  makeThreeDigit_abi_cxx11_(&local_48,(int)(short)iVar4);
  mvwprintw(pWVar3,iVar1 + 1,1,"%s",local_48._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  wrefresh(this->outWin);
  if ((this->numStorage).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[this->current] != (int)(short)iVar4) {
    flash();
  }
  return;
}

Assistant:

void listOutput::takeValue() {
	int val = outArr->nodeGet(OUTPUT_ID);
	mvwprintw(outWin, current + 1, 1, "%s", makeThreeDigit(val).c_str());
	wrefresh(outWin);

	if (val != numStorage[current])
		drawFalse();

	return;
}